

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser.cc
# Opt level: O1

string * __thiscall
rst::Parser::ParseDirectiveType_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  char *pcVar1;
  byte bVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  
  pcVar3 = this->ptr_;
  iVar5 = isalnum((int)*pcVar3);
  pcVar4 = pcVar3;
  if (iVar5 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    do {
      do {
        pcVar7 = pcVar4;
        pcVar1 = pcVar7 + 1;
        bVar2 = pcVar7[1];
        iVar5 = isalnum((int)(char)bVar2);
        pcVar4 = pcVar1;
      } while (iVar5 != 0);
      uVar6 = bVar2 - 0x2b;
      if ((0x34 < uVar6) || ((0x1000000000800dU >> ((ulong)uVar6 & 0x3f) & 1) == 0)) break;
      iVar5 = isalnum((int)pcVar7[2]);
      pcVar4 = pcVar7 + 2;
    } while (iVar5 != 0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (pcVar1 != pcVar3) {
      std::__cxx11::string::replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar3);
    }
    this->ptr_ = pcVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string rst::Parser::ParseDirectiveType() {
  const char *s = ptr_;
  if (!std::isalnum(*s))
    return std::string();
  for (;;) {
    ++s;
    if (std::isalnum(*s))
      continue;
    switch (*s) {
    case '-': case '_': case '+': case ':': case '.':
      if (std::isalnum(s[1])) {
        ++s;
        continue;
      }
      // Fall through.
    }
    break;
  }
  std::string type;
  if (s != ptr_)
    type.assign(ptr_, s);
  ptr_ = s;
  return type;
}